

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

void Lit_PrintTT(uint *tt,int nVars)

{
  int local_18;
  int w;
  int nVars_local;
  uint *tt_local;
  
  for (local_18 = nVars + -1; -1 < local_18; local_18 = local_18 + -1) {
    Abc_Print(-2,"%08X",(ulong)tt[local_18]);
  }
  return;
}

Assistant:

static inline void Lit_PrintTT(unsigned* tt, int nVars) {
    int w;
    for(w=nVars-1; w>=0; w--) {
            Abc_Print(-2, "%08X", tt[w]);
    }
}